

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::GLPositionCase::init
          (GLPositionCase *this,EVP_PKEY_CTX *ctx)

{
  deInt32 *pdVar1;
  ContextInfo *pCVar2;
  pointer pbVar3;
  CaseType CVar4;
  Context *pCVar5;
  RenderContext *renderCtx;
  SharedPtrStateBase *pSVar6;
  RenderTarget *pRVar7;
  long *plVar8;
  SharedPtrStateBase *pSVar9;
  long *extraout_RAX;
  TestError *this_00;
  undefined1 usePointMode;
  size_type *psVar10;
  ContextInfo *pCVar11;
  pointer pbVar12;
  Context *pCVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  _Base_ptr *pp_Var15;
  _Rb_tree_node_base *p_Var16;
  _Base_ptr p_Var17;
  TessPrimitiveType extraout_EDX;
  TessPrimitiveType extraout_EDX_00;
  TessPrimitiveType extraout_EDX_01;
  TessPrimitiveType extraout_EDX_02;
  TessPrimitiveType extraout_EDX_03;
  TessPrimitiveType extraout_EDX_04;
  TessPrimitiveType extraout_EDX_05;
  TessPrimitiveType primType;
  long extraout_RDX;
  char *pcVar18;
  deInt32 *pdVar19;
  long lVar20;
  char *pcVar21;
  bool bVar22;
  string fragmentShaderTemplate;
  string tessellationEvaluationTemplate;
  string tesIn2;
  string tesIn1;
  string tesIn0;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  size_type *local_488;
  value_type local_480;
  string local_460;
  size_type *local_440;
  value_type local_438;
  Context *local_418;
  long local_410;
  Context local_408;
  undefined1 local_3f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_3e0;
  size_type *local_3d0;
  value_type local_3c8;
  Context *local_3a8;
  long local_3a0;
  Context local_398;
  string local_380;
  string local_360;
  string local_340;
  long *local_320 [2];
  long local_310 [2];
  long *local_300 [2];
  long local_2f0 [2];
  long *local_2e0 [2];
  long local_2d0 [2];
  Context *local_2c0;
  long local_2b8;
  Context local_2b0;
  long local_298;
  undefined1 local_290 [40];
  long lStack_268;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_260;
  long local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  _Base_ptr local_230;
  long lStack_228;
  _Rb_tree_node_base *local_220;
  long local_218;
  _Rb_tree_node_base local_210;
  _Rb_tree_node_base local_1f0;
  _Rb_tree_node_base local_1d0;
  _Rb_tree_node_base local_1b0;
  _Rb_tree_node_base local_190;
  _Rb_tree_node_base local_170;
  _Rb_tree_node_base local_150;
  undefined1 local_130 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  undefined1 local_100 [24];
  pointer pbStack_e8;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_70;
  undefined1 local_50 [32];
  
  checkTessellationSupport((this->super_TestCase).m_context);
  pRVar7 = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize
            ((Functional *)(ulong)(uint)pRVar7->m_width,
             (RenderTarget *)(ulong)(uint)pRVar7->m_height,0x100);
  CVar4 = this->m_caseType;
  bVar22 = CVar4 - CASETYPE_TCS_TO_TES < 2;
  pcVar18 = "in_te_attr[0]";
  if (bVar22) {
    pcVar18 = "gl_in[0].gl_Position";
  }
  local_2e0[0] = local_2d0;
  lVar20 = 0xd;
  if (bVar22) {
    lVar20 = 0x14;
  }
  pcVar21 = "in_te_attr[1]";
  if (bVar22) {
    pcVar21 = "gl_in[1].gl_Position";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,pcVar18,pcVar18 + lVar20);
  local_300[0] = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_300,pcVar21,pcVar21 + lVar20);
  pcVar18 = "in_te_attr[2]";
  if (CVar4 - CASETYPE_TCS_TO_TES < 2) {
    pcVar18 = "gl_in[2].gl_Position";
  }
  local_320[0] = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_320,pcVar18,pcVar18 + lVar20);
  pcVar18 = "out highp vec4 in_tc_attr;\n";
  if ((CVar4 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar18 = "";
  }
  local_440 = &local_438._M_string_length;
  pcVar21 = pcVar18 + 0x1b;
  if ((CVar4 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar21 = pcVar18;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_440,pcVar18,pcVar21);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_440,0,(char *)0x0,0x1c46b73);
  local_488 = &local_480._M_string_length;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    local_480._M_string_length = *psVar10;
    local_480.field_2._M_allocated_capacity = plVar8[3];
  }
  else {
    local_480._M_string_length = *psVar10;
    local_488 = (size_type *)*plVar8;
  }
  local_480._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_488);
  pCVar2 = (ContextInfo *)(local_3f0 + 8);
  pCVar11 = (ContextInfo *)(plVar8 + 2);
  if ((ContextInfo *)*plVar8 == pCVar11) {
    local_3f0._8_8_ = pCVar11->_vptr_ContextInfo;
    aStack_3e0._M_allocated_capacity = plVar8[3];
    local_408.m_contextInfo = pCVar2;
  }
  else {
    local_3f0._8_8_ = pCVar11->_vptr_ContextInfo;
    local_408.m_contextInfo = (ContextInfo *)*plVar8;
  }
  local_3f0._0_8_ = plVar8[1];
  *plVar8 = (long)pCVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_408.m_contextInfo);
  pbVar3 = (pointer)(local_100 + 0x10);
  pbVar12 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pbVar12) {
    local_100._16_8_ = (pbVar12->_M_dataplus)._M_p;
    pbStack_e8 = (pointer)plVar8[3];
    local_100._0_8_ = pbVar3;
  }
  else {
    local_100._16_8_ = (pbVar12->_M_dataplus)._M_p;
    local_100._0_8_ = (pointer)*plVar8;
  }
  local_100._8_8_ = plVar8[1];
  *plVar8 = (long)pbVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_100);
  local_2b0.m_contextInfo = (ContextInfo *)local_290;
  pCVar11 = (ContextInfo *)(plVar8 + 2);
  if ((ContextInfo *)*plVar8 == pCVar11) {
    local_290._0_8_ = pCVar11->_vptr_ContextInfo;
    local_290._8_8_ = plVar8[3];
  }
  else {
    local_290._0_8_ = pCVar11->_vptr_ContextInfo;
    local_2b0.m_contextInfo = (ContextInfo *)*plVar8;
  }
  local_298 = plVar8[1];
  *plVar8 = (long)pCVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((pointer)local_100._0_8_ != pbVar3) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if (local_408.m_contextInfo != pCVar2) {
    operator_delete(local_408.m_contextInfo,local_3f0._8_8_ + 1);
  }
  if (local_488 != &local_480._M_string_length) {
    operator_delete(local_488,local_480._M_string_length + 1);
  }
  if (local_440 != &local_438._M_string_length) {
    operator_delete(local_440,local_438._M_string_length + 1);
  }
  pcVar18 = "in highp vec4 in_tc_attr[];\n";
  if ((CVar4 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar18 = "";
  }
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  pcVar21 = pcVar18 + 0x1c;
  if ((CVar4 & ~CASETYPE_VS_TO_TCS_TO_TES) == CASETYPE_VS_TO_TCS) {
    pcVar21 = pcVar18;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_460,pcVar18,pcVar21);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_460,0,(char *)0x0,0x1c46bca);
  local_418 = &local_408;
  pCVar13 = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == pCVar13) {
    local_408.m_testCtx = pCVar13->m_testCtx;
    local_408.m_renderCtx = (RenderContext *)plVar8[3];
  }
  else {
    local_408.m_testCtx = pCVar13->m_testCtx;
    local_418 = (Context *)*plVar8;
  }
  local_410 = plVar8[1];
  *plVar8 = (long)pCVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_418);
  local_3a8 = &local_398;
  pCVar13 = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == pCVar13) {
    local_398.m_testCtx = pCVar13->m_testCtx;
    local_398.m_renderCtx = (RenderContext *)plVar8[3];
  }
  else {
    local_398.m_testCtx = pCVar13->m_testCtx;
    local_3a8 = (Context *)*plVar8;
  }
  local_3a0 = plVar8[1];
  *plVar8 = (long)pCVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_3a8);
  local_3d0 = &local_3c8._M_string_length;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    local_3c8._M_string_length = *psVar10;
    local_3c8.field_2._M_allocated_capacity = plVar8[3];
  }
  else {
    local_3c8._M_string_length = *psVar10;
    local_3d0 = (size_type *)*plVar8;
  }
  local_3c8._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_3d0);
  local_440 = &local_438._M_string_length;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    local_438._M_string_length = *psVar10;
    local_438.field_2._M_allocated_capacity = plVar8[3];
  }
  else {
    local_438._M_string_length = *psVar10;
    local_440 = (size_type *)*plVar8;
  }
  local_438._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_440);
  local_488 = &local_480._M_string_length;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    local_480._M_string_length = *psVar10;
    local_480.field_2._M_allocated_capacity = plVar8[3];
  }
  else {
    local_480._M_string_length = *psVar10;
    local_488 = (size_type *)*plVar8;
  }
  local_480._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_488);
  pCVar11 = (ContextInfo *)(plVar8 + 2);
  if ((ContextInfo *)*plVar8 == pCVar11) {
    local_3f0._8_8_ = pCVar11->_vptr_ContextInfo;
    aStack_3e0._M_allocated_capacity = plVar8[3];
    local_408.m_contextInfo = pCVar2;
  }
  else {
    local_3f0._8_8_ = pCVar11->_vptr_ContextInfo;
    local_408.m_contextInfo = (ContextInfo *)*plVar8;
  }
  local_3f0._0_8_ = plVar8[1];
  *plVar8 = (long)pCVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_408.m_contextInfo);
  pbVar12 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pbVar12) {
    local_100._16_8_ = (pbVar12->_M_dataplus)._M_p;
    pbStack_e8 = (pointer)plVar8[3];
    local_100._0_8_ = pbVar3;
  }
  else {
    local_100._16_8_ = (pbVar12->_M_dataplus)._M_p;
    local_100._0_8_ = (pointer)*plVar8;
  }
  local_100._8_8_ = plVar8[1];
  *plVar8 = (long)pbVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_100);
  local_2c0 = &local_2b0;
  pCVar13 = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == pCVar13) {
    local_2b0.m_testCtx = pCVar13->m_testCtx;
    local_2b0.m_renderCtx = (RenderContext *)plVar8[3];
  }
  else {
    local_2b0.m_testCtx = pCVar13->m_testCtx;
    local_2c0 = (Context *)*plVar8;
  }
  lVar20 = plVar8[1];
  *plVar8 = (long)pCVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  local_2b8 = lVar20;
  if ((pointer)local_100._0_8_ != pbVar3) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
    lVar20 = extraout_RDX;
  }
  usePointMode = SUB81(pCVar13,0);
  primType = (TessPrimitiveType)lVar20;
  if (local_408.m_contextInfo != pCVar2) {
    operator_delete(local_408.m_contextInfo,local_3f0._8_8_ + 1);
    primType = extraout_EDX;
  }
  if (local_488 != &local_480._M_string_length) {
    operator_delete(local_488,local_480._M_string_length + 1);
    primType = extraout_EDX_00;
  }
  if (local_440 != &local_438._M_string_length) {
    operator_delete(local_440,local_438._M_string_length + 1);
    primType = extraout_EDX_01;
  }
  if (local_3d0 != &local_3c8._M_string_length) {
    operator_delete(local_3d0,local_3c8._M_string_length + 1);
    primType = extraout_EDX_02;
  }
  if (local_3a8 != &local_398) {
    operator_delete(local_3a8,(ulong)((long)&(local_398.m_testCtx)->m_platform + 1));
    primType = extraout_EDX_03;
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,(ulong)((long)&(local_408.m_testCtx)->m_platform + 1));
    primType = extraout_EDX_04;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
    primType = extraout_EDX_05;
  }
  Functional::(anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            ((string *)(local_130 + 0x10),(_anonymous_namespace_ *)0x0,primType,(bool)usePointMode);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)(local_130 + 0x10),0,(char *)0x0,0x1c4562f);
  local_290._16_8_ = local_290 + 0x20;
  pCVar11 = (ContextInfo *)(plVar8 + 2);
  if ((ContextInfo *)*plVar8 == pCVar11) {
    local_290._32_8_ = pCVar11->_vptr_ContextInfo;
    lStack_268 = plVar8[3];
  }
  else {
    local_290._32_8_ = pCVar11->_vptr_ContextInfo;
    local_290._16_8_ = (ContextInfo *)*plVar8;
  }
  local_290._24_8_ = plVar8[1];
  *plVar8 = (long)pCVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_290 + 0x10);
  local_260 = &local_250;
  pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar8 + 2);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8 == pbVar14) {
    local_250._M_dataplus._M_p = (pbVar14->_M_dataplus)._M_p;
    local_250._M_string_length = plVar8[3];
  }
  else {
    local_250._M_dataplus._M_p = (pbVar14->_M_dataplus)._M_p;
    local_260 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*plVar8;
  }
  local_258 = plVar8[1];
  *plVar8 = (long)pbVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_260);
  local_250.field_2._M_allocated_capacity = (size_type)&local_230;
  pp_Var15 = (_Base_ptr *)(plVar8 + 2);
  if ((_Base_ptr *)*plVar8 == pp_Var15) {
    local_230 = *pp_Var15;
    lStack_228 = plVar8[3];
  }
  else {
    local_230 = *pp_Var15;
    local_250.field_2._M_allocated_capacity = (size_type)(_Base_ptr *)*plVar8;
  }
  local_250.field_2._8_8_ = plVar8[1];
  *plVar8 = (long)pp_Var15;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_250.field_2._M_local_buf);
  local_220 = &local_210;
  p_Var16 = (_Rb_tree_node_base *)(plVar8 + 2);
  if ((_Rb_tree_node_base *)*plVar8 == p_Var16) {
    local_210._0_8_ = *(undefined8 *)p_Var16;
    local_210._M_parent = (_Base_ptr)plVar8[3];
  }
  else {
    local_210._0_8_ = *(undefined8 *)p_Var16;
    local_220 = (_Rb_tree_node_base *)*plVar8;
  }
  local_218 = plVar8[1];
  *plVar8 = (long)p_Var16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_220,(ulong)local_2e0[0]);
  local_210._M_left = &local_1f0;
  p_Var16 = (_Rb_tree_node_base *)(plVar8 + 2);
  if ((_Rb_tree_node_base *)*plVar8 == p_Var16) {
    local_1f0._0_8_ = *(undefined8 *)p_Var16;
    local_1f0._M_parent = (_Base_ptr)plVar8[3];
  }
  else {
    local_1f0._0_8_ = *(undefined8 *)p_Var16;
    local_210._M_left = (_Rb_tree_node_base *)*plVar8;
  }
  local_210._M_right = (_Base_ptr)plVar8[1];
  *plVar8 = (long)p_Var16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_210._M_left);
  p_Var16 = (_Rb_tree_node_base *)(plVar8 + 2);
  if ((_Rb_tree_node_base *)*plVar8 == p_Var16) {
    local_150._0_8_ = *(undefined8 *)p_Var16;
    local_150._M_parent = (_Base_ptr)plVar8[3];
    local_170._M_left = &local_150;
  }
  else {
    local_150._0_8_ = *(undefined8 *)p_Var16;
    local_170._M_left = (_Rb_tree_node_base *)*plVar8;
  }
  local_170._M_right = (_Base_ptr)plVar8[1];
  *plVar8 = (long)p_Var16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_170._M_left,(ulong)local_300[0]);
  local_1f0._M_left = &local_1d0;
  p_Var16 = (_Rb_tree_node_base *)(plVar8 + 2);
  if ((_Rb_tree_node_base *)*plVar8 == p_Var16) {
    local_1d0._0_8_ = *(undefined8 *)p_Var16;
    local_1d0._M_parent = (_Base_ptr)plVar8[3];
  }
  else {
    local_1d0._0_8_ = *(undefined8 *)p_Var16;
    local_1f0._M_left = (_Rb_tree_node_base *)*plVar8;
  }
  local_1f0._M_right = (_Base_ptr)plVar8[1];
  *plVar8 = (long)p_Var16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f0._M_left);
  local_1d0._M_left = &local_1b0;
  p_Var16 = (_Rb_tree_node_base *)(plVar8 + 2);
  if ((_Rb_tree_node_base *)*plVar8 == p_Var16) {
    local_1b0._0_8_ = *(undefined8 *)p_Var16;
    local_1b0._M_parent = (_Base_ptr)plVar8[3];
  }
  else {
    local_1b0._0_8_ = *(undefined8 *)p_Var16;
    local_1d0._M_left = (_Rb_tree_node_base *)*plVar8;
  }
  local_1d0._M_right = (_Base_ptr)plVar8[1];
  *plVar8 = (long)p_Var16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_1d0._M_left,(ulong)local_320[0]);
  local_1b0._M_left = &local_190;
  p_Var16 = (_Rb_tree_node_base *)(plVar8 + 2);
  if ((_Rb_tree_node_base *)*plVar8 == p_Var16) {
    local_190._0_8_ = *(undefined8 *)p_Var16;
    local_190._M_parent = (_Base_ptr)plVar8[3];
  }
  else {
    local_190._0_8_ = *(undefined8 *)p_Var16;
    local_1b0._M_left = (_Rb_tree_node_base *)*plVar8;
  }
  local_1b0._M_right = (_Base_ptr)plVar8[1];
  *plVar8 = (long)p_Var16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1b0._M_left);
  local_190._M_left = &local_170;
  p_Var16 = (_Rb_tree_node_base *)(plVar8 + 2);
  if ((_Rb_tree_node_base *)*plVar8 == p_Var16) {
    local_170._0_8_ = *(undefined8 *)p_Var16;
    local_170._M_parent = (_Base_ptr)plVar8[3];
  }
  else {
    local_170._0_8_ = *(undefined8 *)p_Var16;
    local_190._M_left = (_Rb_tree_node_base *)*plVar8;
  }
  local_190._M_right = (_Base_ptr)plVar8[1];
  *plVar8 = (long)p_Var16;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_190._M_left,(ulong)local_2e0[0]);
  p_Var17 = (_Base_ptr)(plVar8 + 2);
  if ((_Base_ptr)*plVar8 == p_Var17) {
    local_130._0_8_ = *(undefined8 *)p_Var17;
    local_130._8_8_ = plVar8[3];
    local_150._M_left = (_Base_ptr)local_130;
  }
  else {
    local_130._0_8_ = *(undefined8 *)p_Var17;
    local_150._M_left = (_Base_ptr)*plVar8;
  }
  local_150._M_right = (_Base_ptr)plVar8[1];
  *plVar8 = (long)p_Var17;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_150._M_left);
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_380.field_2._M_allocated_capacity = *psVar10;
    local_380.field_2._8_8_ = plVar8[3];
  }
  else {
    local_380.field_2._M_allocated_capacity = *psVar10;
    local_380._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_380._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_380,(ulong)local_300[0]);
  local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_360.field_2._M_allocated_capacity = *psVar10;
    local_360.field_2._8_8_ = plVar8[3];
  }
  else {
    local_360.field_2._M_allocated_capacity = *psVar10;
    local_360._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_360._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_360);
  local_340._M_dataplus._M_p = (pointer)&local_340.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_340.field_2._M_allocated_capacity = *psVar10;
    local_340.field_2._8_8_ = plVar8[3];
  }
  else {
    local_340.field_2._M_allocated_capacity = *psVar10;
    local_340._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_340._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_340,(ulong)local_320[0]);
  local_460._M_dataplus._M_p = (pointer)&local_460.field_2;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar10) {
    local_460.field_2._M_allocated_capacity = *psVar10;
    local_460.field_2._8_8_ = plVar8[3];
  }
  else {
    local_460.field_2._M_allocated_capacity = *psVar10;
    local_460._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_460._M_string_length = plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_460);
  pCVar13 = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == pCVar13) {
    local_408.m_testCtx = pCVar13->m_testCtx;
    local_408.m_renderCtx = (RenderContext *)plVar8[3];
    local_418 = &local_408;
  }
  else {
    local_408.m_testCtx = pCVar13->m_testCtx;
    local_418 = (Context *)*plVar8;
  }
  local_410 = plVar8[1];
  *plVar8 = (long)pCVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_418,(ulong)local_2e0[0]);
  local_3d0 = &local_3c8._M_string_length;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    local_3c8._M_string_length = *psVar10;
    local_3c8.field_2._M_allocated_capacity = plVar8[3];
  }
  else {
    local_3c8._M_string_length = *psVar10;
    local_3d0 = (size_type *)*plVar8;
  }
  local_3c8._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_3d0);
  local_440 = &local_438._M_string_length;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    local_438._M_string_length = *psVar10;
    local_438.field_2._M_allocated_capacity = plVar8[3];
  }
  else {
    local_438._M_string_length = *psVar10;
    local_440 = (size_type *)*plVar8;
  }
  local_438._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_440,(ulong)local_300[0]);
  local_488 = &local_480._M_string_length;
  psVar10 = (size_type *)(plVar8 + 2);
  if ((size_type *)*plVar8 == psVar10) {
    local_480._M_string_length = *psVar10;
    local_480.field_2._M_allocated_capacity = plVar8[3];
  }
  else {
    local_480._M_string_length = *psVar10;
    local_488 = (size_type *)*plVar8;
  }
  local_480._M_dataplus._M_p = (pointer)plVar8[1];
  *plVar8 = (long)psVar10;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_488);
  pCVar11 = (ContextInfo *)(plVar8 + 2);
  if ((ContextInfo *)*plVar8 == pCVar11) {
    local_3f0._8_8_ = pCVar11->_vptr_ContextInfo;
    aStack_3e0._M_allocated_capacity = plVar8[3];
    local_408.m_contextInfo = pCVar2;
  }
  else {
    local_3f0._8_8_ = pCVar11->_vptr_ContextInfo;
    local_408.m_contextInfo = (ContextInfo *)*plVar8;
  }
  local_3f0._0_8_ = plVar8[1];
  *plVar8 = (long)pCVar11;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_408.m_contextInfo,(ulong)local_320[0]);
  pbVar12 = (pointer)(plVar8 + 2);
  if ((pointer)*plVar8 == pbVar12) {
    local_100._16_8_ = (pbVar12->_M_dataplus)._M_p;
    pbStack_e8 = (pointer)plVar8[3];
    local_100._0_8_ = pbVar3;
  }
  else {
    local_100._16_8_ = (pbVar12->_M_dataplus)._M_p;
    local_100._0_8_ = (pointer)*plVar8;
  }
  local_100._8_8_ = plVar8[1];
  *plVar8 = (long)pbVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_100);
  local_3a8 = &local_398;
  pCVar13 = (Context *)(plVar8 + 2);
  if ((Context *)*plVar8 == pCVar13) {
    local_398.m_testCtx = pCVar13->m_testCtx;
    local_398.m_renderCtx = (RenderContext *)plVar8[3];
  }
  else {
    local_398.m_testCtx = pCVar13->m_testCtx;
    local_3a8 = (Context *)*plVar8;
  }
  local_3a0 = plVar8[1];
  *plVar8 = (long)pCVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((pointer)local_100._0_8_ != pbVar3) {
    operator_delete((void *)local_100._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_100._16_8_)->_M_p + 1));
  }
  if (local_408.m_contextInfo != pCVar2) {
    operator_delete(local_408.m_contextInfo,local_3f0._8_8_ + 1);
  }
  if (local_488 != &local_480._M_string_length) {
    operator_delete(local_488,local_480._M_string_length + 1);
  }
  if (local_440 != &local_438._M_string_length) {
    operator_delete(local_440,local_438._M_string_length + 1);
  }
  if (local_3d0 != &local_3c8._M_string_length) {
    operator_delete(local_3d0,local_3c8._M_string_length + 1);
  }
  if (local_418 != &local_408) {
    operator_delete(local_418,(ulong)((long)&(local_408.m_testCtx)->m_platform + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if (local_150._M_left != (_Base_ptr)local_130) {
    operator_delete(local_150._M_left,local_130._0_8_ + 1);
  }
  if (local_190._M_left != &local_170) {
    operator_delete(local_190._M_left,local_170._0_8_ + 1);
  }
  if (local_1b0._M_left != &local_190) {
    operator_delete(local_1b0._M_left,local_190._0_8_ + 1);
  }
  if (local_1d0._M_left != &local_1b0) {
    operator_delete(local_1d0._M_left,local_1b0._0_8_ + 1);
  }
  if (local_1f0._M_left != &local_1d0) {
    operator_delete(local_1f0._M_left,local_1d0._0_8_ + 1);
  }
  if (local_170._M_left != &local_150) {
    operator_delete(local_170._M_left,local_150._0_8_ + 1);
  }
  if (local_210._M_left != &local_1f0) {
    operator_delete(local_210._M_left,local_1f0._0_8_ + 1);
  }
  if (local_220 != &local_210) {
    operator_delete(local_220,local_210._0_8_ + 1);
  }
  if ((_Base_ptr *)local_250.field_2._M_allocated_capacity != &local_230) {
    operator_delete((void *)local_250.field_2._M_allocated_capacity,
                    (ulong)((long)&local_230->_M_color + 1));
  }
  if (local_260 != &local_250) {
    operator_delete(local_260,(ulong)(local_250._M_dataplus._M_p + 1));
  }
  if ((ContextInfo *)local_290._16_8_ != (ContextInfo *)(local_290 + 0x20)) {
    operator_delete((void *)local_290._16_8_,
                    (ulong)((long)&((_Alloc_hider *)local_290._32_8_)->_M_p + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._16_8_ != &local_110) {
    operator_delete((void *)local_130._16_8_,local_110._M_allocated_capacity + 1);
  }
  local_418 = &local_408;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_418,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin highp vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,"");
  local_398.m_contextInfo = (ContextInfo *)operator_new(0xd0);
  pCVar5 = (this->super_TestCase).m_context;
  renderCtx = pCVar5->m_renderCtx;
  memset(local_100,0,0xac);
  local_50._0_8_ = (pointer)0x0;
  local_50[8] = 0;
  local_50._9_7_ = 0;
  local_50[0x10] = 0;
  local_50._17_8_ = 0;
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_460,(_anonymous_namespace_ *)pCVar5->m_renderCtx,
             (Context *)local_2b0.m_contextInfo,(char *)pCVar13);
  local_408.m_contextInfo = (ContextInfo *)((ulong)local_408.m_contextInfo & 0xffffffff00000000);
  local_3f0._0_8_ = &aStack_3e0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_3f0,local_460._M_dataplus._M_p,
             local_460._M_dataplus._M_p + local_460._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_408.m_contextInfo & 0xffffffff) * 0x18),
              (value_type *)local_3f0);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_340,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_2c0,(char *)pCVar13);
  local_488 = (size_type *)CONCAT44(local_488._4_4_,3);
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,local_340._M_dataplus._M_p,
             local_340._M_dataplus._M_p + local_340._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_488 & 0xffffffff) * 0x18),&local_480);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_360,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_3a8,(char *)pCVar13);
  local_440 = (size_type *)CONCAT44(local_440._4_4_,4);
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_438,local_360._M_dataplus._M_p,
             local_360._M_dataplus._M_p + local_360._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_440 & 0xffffffff) * 0x18),&local_438);
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_380,(_anonymous_namespace_ *)((this->super_TestCase).m_context)->m_renderCtx,
             local_418,(char *)pCVar13);
  local_3d0 = (size_type *)CONCAT44(local_3d0._4_4_,1);
  local_3c8._M_dataplus._M_p = (pointer)&local_3c8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_3c8,local_380._M_dataplus._M_p,
             local_380._M_dataplus._M_p + local_380._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + ((ulong)local_3d0 & 0xffffffff) * 0x18),&local_3c8);
  glu::ShaderProgram::ShaderProgram
            ((ShaderProgram *)local_398.m_contextInfo,renderCtx,(ProgramSources *)local_100);
  pSVar9 = (SharedPtrStateBase *)operator_new(0x20);
  pdVar1 = &pSVar9->strongRefCount;
  pSVar9->strongRefCount = 0;
  pSVar9->weakRefCount = 0;
  pSVar9->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_02137b98;
  pSVar9[1]._vptr_SharedPtrStateBase = (_func_int **)local_398.m_contextInfo;
  pSVar9->strongRefCount = 1;
  pSVar9->weakRefCount = 1;
  pSVar6 = (this->m_program).m_state;
  if (pSVar6 != pSVar9) {
    if (pSVar6 != (SharedPtrStateBase *)0x0) {
      LOCK();
      pdVar19 = &pSVar6->strongRefCount;
      *pdVar19 = *pdVar19 + -1;
      UNLOCK();
      if (*pdVar19 == 0) {
        (this->m_program).m_ptr = (ShaderProgram *)0x0;
        (*((this->m_program).m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar19 = &((this->m_program).m_state)->weakRefCount;
      *pdVar19 = *pdVar19 + -1;
      UNLOCK();
      if (*pdVar19 == 0) {
        pSVar6 = (this->m_program).m_state;
        if (pSVar6 != (SharedPtrStateBase *)0x0) {
          (*pSVar6->_vptr_SharedPtrStateBase[1])();
        }
        (this->m_program).m_state = (SharedPtrStateBase *)0x0;
      }
    }
    (this->m_program).m_ptr = (ShaderProgram *)local_398.m_contextInfo;
    (this->m_program).m_state = pSVar9;
    LOCK();
    pSVar9->strongRefCount = pSVar9->strongRefCount + 1;
    UNLOCK();
    LOCK();
    pdVar19 = &((this->m_program).m_state)->weakRefCount;
    *pdVar19 = *pdVar19 + 1;
    UNLOCK();
  }
  pdVar19 = &pSVar9->weakRefCount;
  LOCK();
  *pdVar1 = *pdVar1 + -1;
  UNLOCK();
  if (*pdVar1 == 0) {
    (*pSVar9->_vptr_SharedPtrStateBase[2])(pSVar9);
  }
  LOCK();
  *pdVar19 = *pdVar19 + -1;
  UNLOCK();
  if (*pdVar19 == 0) {
    (*pSVar9->_vptr_SharedPtrStateBase[1])(pSVar9);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3c8._M_dataplus._M_p != &local_3c8.field_2) {
    operator_delete(local_3c8._M_dataplus._M_p,local_3c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p,local_340.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._0_8_ != &aStack_3e0) {
    operator_delete((void *)local_3f0._0_8_,aStack_3e0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460._M_dataplus._M_p != &local_460.field_2) {
    operator_delete(local_460._M_dataplus._M_p,local_460.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_70);
  lVar20 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_100 + lVar20));
    lVar20 = lVar20 + -0x18;
  } while (lVar20 != -0x18);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk != false) {
    if (local_418 != &local_408) {
      operator_delete(local_418,(ulong)((long)&(local_408.m_testCtx)->m_platform + 1));
    }
    if (local_3a8 != &local_398) {
      operator_delete(local_3a8,(ulong)((long)&(local_398.m_testCtx)->m_platform + 1));
    }
    if (local_2c0 != &local_2b0) {
      operator_delete(local_2c0,(ulong)((long)&(local_2b0.m_testCtx)->m_platform + 1));
    }
    if (local_2b0.m_contextInfo != (ContextInfo *)local_290) {
      operator_delete(local_2b0.m_contextInfo,(ulong)((long)(Platform **)local_290._0_8_ + 1));
    }
    if (local_320[0] != local_310) {
      operator_delete(local_320[0],local_310[0] + 1);
    }
    if (local_300[0] != local_2f0) {
      operator_delete(local_300[0],local_2f0[0] + 1);
    }
    plVar8 = local_2d0;
    if (local_2e0[0] != plVar8) {
      operator_delete(local_2e0[0],local_2d0[0] + 1);
      plVar8 = extraout_RAX;
    }
    return (int)plVar8;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Program compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
             ,0x1914);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void GLPositionCase::init (void)
{
	checkTessellationSupport(m_context);
	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	const bool		vsToTCS		= m_caseType == CASETYPE_VS_TO_TCS		|| m_caseType == CASETYPE_VS_TO_TCS_TO_TES;
	const bool		tcsToTES	= m_caseType == CASETYPE_TCS_TO_TES		|| m_caseType == CASETYPE_VS_TO_TCS_TO_TES;

	const string	tesIn0		= tcsToTES ? "gl_in[0].gl_Position" : "in_te_attr[0]";
	const string	tesIn1		= tcsToTES ? "gl_in[1].gl_Position" : "in_te_attr[1]";
	const string	tesIn2		= tcsToTES ? "gl_in[2].gl_Position" : "in_te_attr[2]";

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "in highp vec4 in_v_attr;\n"
												 + string(!vsToTCS ? "out highp vec4 in_tc_attr;\n" : "") +
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	" + (vsToTCS ? "gl_Position" : "in_tc_attr") + " = in_v_attr;\n"
												 "}\n");
	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 "layout (vertices = 3) out;\n"
												 "\n"
												 + string(!vsToTCS ? "in highp vec4 in_tc_attr[];\n" : "") +
												 "\n"
												 + (!tcsToTES ? "out highp vec4 in_te_attr[];\n" : "") +
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	" + (tcsToTES ? "gl_out[gl_InvocationID].gl_Position" : "in_te_attr[gl_InvocationID]") + " = "
													  + (vsToTCS ? "gl_in[gl_InvocationID].gl_Position" : "in_tc_attr[gl_InvocationID]") + ";\n"
												 "\n"
												 "	gl_TessLevelInner[0] = 2.0;\n"
												 "	gl_TessLevelInner[1] = 3.0;\n"
												 "\n"
												 "	gl_TessLevelOuter[0] = 4.0;\n"
												 "	gl_TessLevelOuter[1] = 5.0;\n"
												 "	gl_TessLevelOuter[2] = 6.0;\n"
												 "	gl_TessLevelOuter[3] = 7.0;\n"
												 "}\n");
	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 "\n"
												 + getTessellationEvaluationInLayoutString(TESSPRIMITIVETYPE_TRIANGLES) +
												 "\n"
												 + (!tcsToTES ? "in highp vec4 in_te_attr[];\n" : "") +
												 "\n"
												 "out highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	highp vec2 xy = gl_TessCoord.x * " + tesIn0 + ".xy\n"
												 "	              + gl_TessCoord.y * " + tesIn1 + ".xy\n"
												 "	              + gl_TessCoord.z * " + tesIn2 + ".xy;\n"
												 "	gl_Position = vec4(xy, 0.0, 1.0);\n"
												 "	in_f_color = vec4(" + tesIn0 + ".z + " + tesIn1 + ".w,\n"
												 "	                  " + tesIn2 + ".z + " + tesIn0 + ".w,\n"
												 "	                  " + tesIn1 + ".z + " + tesIn2 + ".w,\n"
												 "	                  1.0);\n"
												 "}\n");
	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
												 "\n"
												 "layout (location = 0) out mediump vec4 o_color;\n"
												 "\n"
												 "in highp vec4 in_f_color;\n"
												 "\n"
												 "void main (void)\n"
												 "{\n"
												 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
		<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
		<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
		<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
		<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}